

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer.h
# Opt level: O1

bool __thiscall Slicer::buildDG(Slicer *this,bool compute_deps)

{
  LLVMDependenceGraph *pLVar1;
  LLVMDependenceGraph *pLVar2;
  unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_> *puVar3;
  raw_ostream *this_00;
  StringRef Str;
  
  puVar3 = dg::llvmdg::LLVMDependenceGraphBuilder::constructCFGOnly(&this->_builder);
  pLVar1 = (puVar3->_M_t).
           super___uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
           ._M_t.
           super__Tuple_impl<0UL,_dg::LLVMDependenceGraph_*,_std::default_delete<dg::LLVMDependenceGraph>_>
           .super__Head_base<0UL,_dg::LLVMDependenceGraph_*,_false>._M_head_impl;
  (puVar3->_M_t).
  super___uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>._M_t
  .super__Tuple_impl<0UL,_dg::LLVMDependenceGraph_*,_std::default_delete<dg::LLVMDependenceGraph>_>.
  super__Head_base<0UL,_dg::LLVMDependenceGraph_*,_false>._M_head_impl = (LLVMDependenceGraph *)0x0;
  pLVar2 = (this->_dg)._M_t.
           super___uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
           ._M_t.
           super__Tuple_impl<0UL,_dg::LLVMDependenceGraph_*,_std::default_delete<dg::LLVMDependenceGraph>_>
           .super__Head_base<0UL,_dg::LLVMDependenceGraph_*,_false>._M_head_impl;
  (this->_dg)._M_t.
  super___uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>._M_t
  .super__Tuple_impl<0UL,_dg::LLVMDependenceGraph_*,_std::default_delete<dg::LLVMDependenceGraph>_>.
  super__Head_base<0UL,_dg::LLVMDependenceGraph_*,_false>._M_head_impl = pLVar1;
  if (pLVar2 != (LLVMDependenceGraph *)0x0) {
    (**(code **)(*(long *)pLVar2 + 8))();
  }
  pLVar1 = (this->_dg)._M_t.
           super___uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
           ._M_t.
           super__Tuple_impl<0UL,_dg::LLVMDependenceGraph_*,_std::default_delete<dg::LLVMDependenceGraph>_>
           .super__Head_base<0UL,_dg::LLVMDependenceGraph_*,_false>._M_head_impl;
  if (pLVar1 == (LLVMDependenceGraph *)0x0) {
    this_00 = (raw_ostream *)llvm::errs();
    Str.Length = 0x26;
    Str.Data = "Building the dependence graph failed!\n";
    llvm::raw_ostream::operator<<(this_00,Str);
  }
  else if (compute_deps) {
    computeDependencies(this);
  }
  return pLVar1 != (LLVMDependenceGraph *)0x0;
}

Assistant:

bool buildDG(bool compute_deps = false) {
        _dg = std::move(_builder.constructCFGOnly());

        if (!_dg) {
            llvm::errs() << "Building the dependence graph failed!\n";
            return false;
        }

        if (compute_deps)
            computeDependencies();

        return true;
    }